

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer *
SerializePointer<sector_t_const>
          (FSerializer *arc,char *key,sector_t_conflict **value,sector_t_conflict **defval,
          sector_t_conflict *base)

{
  uint uVar1;
  sector_t_conflict *psVar2;
  int64_t vv;
  
  if (base == (sector_t_conflict *)0x0) {
    __assert_fail("base != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                  ,0x59f,
                  "FSerializer &SerializePointer(FSerializer &, const char *, T *&, T **, T *) [T = const sector_t]"
                 );
  }
  if (arc->r == (FReader *)0x0) {
    uVar1 = (arc->w->mInObject).Count;
    if (((uVar1 != 0) && (defval != (sector_t_conflict **)0x0)) &&
       ((arc->w->mInObject).Array[uVar1 - 1] != false)) {
      psVar2 = *value;
      if (psVar2 == *defval) {
        return arc;
      }
      goto LAB_00474de1;
    }
  }
  psVar2 = *value;
LAB_00474de1:
  if (psVar2 == (sector_t_conflict *)0x0) {
    vv = -1;
  }
  else {
    vv = ((long)psVar2 - (long)base) / 0x218;
  }
  Serialize(arc,key,&vv,(int64_t *)0x0);
  psVar2 = base + vv;
  if (vv < 0) {
    psVar2 = (sector_t_conflict *)0x0;
  }
  *value = psVar2;
  return arc;
}

Assistant:

FSerializer &SerializePointer(FSerializer &arc, const char *key, T *&value, T **defval, T *base)
{
	assert(base != nullptr);
	if (arc.isReading() || !arc.w->inObject() || defval == nullptr || value != *defval)
	{
		int64_t vv = value == nullptr ? -1 : value - base;
		Serialize(arc, key, vv, nullptr);
		value = vv < 0 ? nullptr : base + vv;
	}
	return arc;
}